

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Own<kj::AsyncOutputStream,_std::nullptr_t> __thiscall
kj::anon_unknown_36::HttpClientAdapter::ConnectResponseImpl::reject
          (ConnectResponseImpl *this,uint statusCode,StringPtr statusText,HttpHeaders *headers,
          Maybe<unsigned_long> expectedBodySize)

{
  AsyncInputStream *pAVar1;
  AsyncOutputStream *extraout_RDX_00;
  AsyncOutputStream *extraout_RDX_01;
  AsyncOutputStream *pAVar2;
  undefined4 in_register_00000034;
  HttpHeaders *in_R9;
  Own<kj::AsyncOutputStream,_std::nullptr_t> OVar3;
  StringPtr statusText_00;
  bool _kjCondition;
  Maybe<kj::Own<kj::AsyncInputStream,_std::nullptr_t>_> local_70;
  OneWayPipe pipe;
  Maybe<unsigned_long> local_40;
  AsyncOutputStream *extraout_RDX;
  
  _kjCondition = (uint)statusText.content.ptr - 300 < 0xffffff9c;
  if (_kjCondition) {
    local_40.ptr.isSet = false;
    newOneWayPipe(&pipe,&local_40);
    local_70.ptr.disposer = pipe.in.disposer;
    local_70.ptr.ptr = pipe.in.ptr;
    pipe.in.ptr = (AsyncInputStream *)0x0;
    statusText_00.content.size_ = (size_t)headers;
    statusText_00.content.ptr = (char *)statusText.content.size_;
    respond((ConnectResponseImpl *)CONCAT44(in_register_00000034,statusCode),
            (uint)statusText.content.ptr,statusText_00,in_R9,&local_70);
    pAVar1 = local_70.ptr.ptr;
    pAVar2 = extraout_RDX;
    if (local_70.ptr.ptr != (AsyncInputStream *)0x0) {
      local_70.ptr.ptr = (AsyncInputStream *)0x0;
      (**(local_70.ptr.disposer)->_vptr_Disposer)
                (local_70.ptr.disposer,
                 pAVar1->_vptr_AsyncInputStream[-2] + (long)&pAVar1->_vptr_AsyncInputStream);
      pAVar2 = extraout_RDX_00;
    }
    pAVar1 = pipe.in.ptr;
    (this->super_ConnectResponse)._vptr_ConnectResponse = (_func_int **)pipe.out.disposer;
    (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)pipe.out.ptr;
    pipe.out.ptr = (AsyncOutputStream *)0x0;
    if (pipe.in.ptr != (AsyncInputStream *)0x0) {
      pipe.in.ptr = (AsyncInputStream *)0x0;
      (**(pipe.in.disposer)->_vptr_Disposer)
                (pipe.in.disposer,
                 pAVar1->_vptr_AsyncInputStream[-2] + (long)&pAVar1->_vptr_AsyncInputStream);
      pAVar2 = extraout_RDX_01;
    }
    OVar3.ptr = pAVar2;
    OVar3.disposer = (Disposer *)this;
    return OVar3;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[43]>
            ((Fault *)&pipe,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x1bdf,FAILED,"statusCode < 200 || statusCode >= 300",
             "_kjCondition,\"the statusCode must not be 2xx for reject.\"",&_kjCondition,
             (char (*) [43])"the statusCode must not be 2xx for reject.");
  kj::_::Debug::Fault::fatal((Fault *)&pipe);
}

Assistant:

kj::Own<kj::AsyncOutputStream> reject(
        uint statusCode,
        kj::StringPtr statusText,
        const HttpHeaders& headers,
        kj::Maybe<uint64_t> expectedBodySize = kj::none) override {
      KJ_REQUIRE(statusCode < 200 || statusCode >= 300,
          "the statusCode must not be 2xx for reject.");
      auto pipe = kj::newOneWayPipe();
      respond(statusCode, statusText, headers, kj::mv(pipe.in));
      return kj::mv(pipe.out);
    }